

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

Result wabt::ResolveNamesScript(Script *script,Errors *errors)

{
  pointer puVar1;
  Command *pCVar2;
  _func_int **pp_Var3;
  Result RVar4;
  AssertModuleCommand<(wabt::CommandType)5> *assert_invalid_command;
  unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *command;
  pointer puVar5;
  Errors errors_1;
  NameResolver resolver;
  Errors local_1a8;
  NameResolver local_190;
  NameResolver local_e0;
  
  local_e0.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameResolver_00190ff0;
  local_e0.current_module_ = (Module *)0x0;
  local_e0.current_func_ = (Func *)0x0;
  local_e0.errors_ = errors;
  local_e0.script_ = script;
  ExprVisitor::ExprVisitor(&local_e0.visitor_,(Delegate *)&local_e0);
  local_e0.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_e0._164_8_ = 0;
  local_e0.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_e0.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  puVar5 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    do {
      pCVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      switch(pCVar2->type) {
      case First:
      case ScriptModule:
LAB_0015d89e:
        anon_unknown_14::NameResolver::VisitModule(&local_e0,(Module *)(pCVar2 + 1));
        break;
      case AssertInvalid:
        local_1a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_190.super_DelegateNop.super_Delegate._vptr_Delegate =
             (Delegate)&PTR__NameResolver_00190ff0;
        local_190.script_ = local_e0.script_;
        local_190.current_module_ = (Module *)0x0;
        local_190.current_func_ = (Func *)0x0;
        local_190.errors_ = &local_1a8;
        ExprVisitor::ExprVisitor(&local_190.visitor_,(Delegate *)&local_190);
        local_190.labels_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_190._164_8_ = 0;
        local_190.labels_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_190.labels_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        local_190.labels_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        pp_Var3 = pCVar2[1]._vptr_Command;
        if ((pp_Var3 != (_func_int **)0x0) && (*(int *)(pp_Var3 + 1) == 0)) {
          anon_unknown_14::NameResolver::VisitModule(&local_190,(Module *)(pp_Var3 + 2));
        }
        local_190.super_DelegateNop.super_Delegate._vptr_Delegate =
             (Delegate)&PTR__NameResolver_00190ff0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_190.labels_);
        if (local_190.visitor_.catch_index_stack_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_190.visitor_.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_190.visitor_.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_190.visitor_.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_190.visitor_.expr_iter_stack_.
            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_190.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_190.visitor_.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_190.visitor_.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_190.visitor_.expr_stack_.
            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_190.visitor_.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_190.visitor_.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_190.visitor_.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_190.visitor_.state_stack_.
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_190.visitor_.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_190.visitor_.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_190.visitor_.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_1a8);
        break;
      case AssertUnlinkable:
      case AssertUninstantiable:
        pCVar2 = (Command *)pCVar2[1]._vptr_Command;
        if ((pCVar2 != (Command *)0x0) && (pCVar2->type == First)) goto LAB_0015d89e;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  RVar4.enum_ = local_e0.result_.enum_;
  local_e0.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameResolver_00190ff0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0.labels_);
  if (local_e0.visitor_.catch_index_stack_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.visitor_.catch_index_stack_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.visitor_.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.visitor_.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.visitor_.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.visitor_.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.visitor_.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.visitor_.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.visitor_.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.visitor_.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.visitor_.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result ResolveNamesScript(Script* script, Errors* errors) {
  NameResolver resolver(script, errors);
  return resolver.VisitScript(script);
}